

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

int hessian_fd2(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f)

{
  ulong uVar1;
  size_t __size;
  double dVar2;
  void *__ptr;
  void *__ptr_00;
  ulong uVar3;
  double *pdVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  void *local_88;
  double *local_80;
  void *local_78;
  ulong local_70;
  
  dVar8 = pow(eps,0.3333333333333333);
  __size = (long)N * 8;
  __ptr = malloc(__size);
  __ptr_00 = malloc(__size);
  dVar9 = (*funcpt->funcpt)(x,N,funcpt->params);
  if (1.79769313486232e+308 <= ABS(dVar9)) {
LAB_0012445f:
    pcVar5 = "Program Exiting as the function value exceeds the maximum double value";
  }
  else {
    if (!NAN(dVar9)) {
      if (0 < N) {
        uVar3 = (ulong)(uint)N;
        uVar6 = 0;
        do {
          dVar10 = x[uVar6];
          dVar11 = dVar10;
          if (ABS(dVar10) < 1.0 / ABS(dx[uVar6])) {
            dVar10 = signx(dVar10);
            dVar10 = dVar10 / ABS(dx[uVar6]);
            dVar11 = x[uVar6];
          }
          dVar10 = dVar10 * dVar8 + dVar11;
          x[uVar6] = dVar10;
          *(double *)((long)__ptr + uVar6 * 8) = dVar10 - dVar11;
          dVar10 = (*funcpt->funcpt)(x,N,funcpt->params);
          *(double *)((long)__ptr_00 + uVar6 * 8) = dVar10;
          if (1.79769313486232e+308 <= ABS(dVar10)) goto LAB_0012447b;
          if (NAN(dVar10)) goto LAB_00124484;
          x[uVar6] = dVar11;
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
        if (0 < N) {
          local_80 = f + 1;
          pdVar4 = x + 1;
          uVar6 = 0;
          local_88 = __ptr;
          local_78 = __ptr_00;
          local_70 = uVar3;
          do {
            local_70 = local_70 - 1;
            local_78 = (void *)((long)local_78 + 8);
            local_88 = (void *)((long)local_88 + 8);
            dVar8 = x[uVar6];
            dVar10 = *(double *)((long)__ptr + uVar6 * 8);
            x[uVar6] = dVar10 + dVar10 + dVar8;
            dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
            if (1.79769313486232e+308 <= ABS(dVar11)) goto LAB_0012445f;
            if (NAN(dVar11)) goto LAB_001244bb;
            dVar2 = *(double *)((long)__ptr_00 + uVar6 * 8);
            dVar13 = dVar9 - dVar2;
            f[uVar6 + (uint)((int)uVar6 * N)] = ((dVar11 + dVar13) - dVar2) / (dVar10 * dVar10);
            x[uVar6] = dVar8 + dVar10;
            uVar1 = uVar6 + 1;
            if ((long)uVar1 < (long)N) {
              uVar7 = 0;
              do {
                dVar11 = pdVar4[uVar7];
                dVar2 = *(double *)((long)local_88 + uVar7 * 8);
                pdVar4[uVar7] = dVar11 + dVar2;
                dVar12 = (*funcpt->funcpt)(x,N,funcpt->params);
                if (1.79769313486232e+308 <= ABS(dVar12)) goto LAB_0012447b;
                if (NAN(dVar12)) goto LAB_00124484;
                local_80[uVar7] =
                     ((dVar12 + dVar13) - *(double *)((long)local_78 + uVar7 * 8)) /
                     (dVar2 * dVar10);
                pdVar4[uVar7] = dVar11;
                uVar7 = uVar7 + 1;
              } while (local_70 != uVar7);
            }
            x[uVar6] = dVar8;
            local_80 = local_80 + uVar3 + 1;
            pdVar4 = pdVar4 + 1;
            uVar6 = uVar1;
          } while (uVar1 != uVar3);
        }
      }
      free(__ptr);
      free(__ptr_00);
      return 0;
    }
LAB_001244bb:
    pcVar5 = "Program Exiting as the function returns NaN";
  }
  printf(pcVar5);
  free(__ptr);
  goto LAB_0012449f;
LAB_0012447b:
  pcVar5 = "Program Exiting as the function value exceeds the maximum double value";
  goto LAB_0012448b;
LAB_00124484:
  pcVar5 = "Program Exiting as the function returns NaN";
LAB_0012448b:
  printf(pcVar5);
  free(__ptr);
LAB_0012449f:
  free(__ptr_00);
  return 0xf;
}

Assistant:

int hessian_fd2(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f) {
	int i,j,step,retval;
	double fd,temp,ft,fc,temp2,stepmax;
	double *stepsize,*f2;
	/*
	Returns Upper Triangular matrix only. If you want the full matrix then either use hessian_fd or copy the upper triangular value to lower triangle.
	*/
	fd = pow((double) eps,1.0/3.0);
	
	stepsize = (double*) malloc(sizeof(double) *N);
	f2 = (double*) malloc(sizeof(double) *N);
	retval = 0;
	fc = FUNCPT_EVAL(funcpt,x,N);
	if (fc >= DBL_MAX || fc <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(stepsize);
		free(f2);
		return 15;
	}
	if (fc != fc) {
		printf("Program Exiting as the function returns NaN");
		free(stepsize);
		free(f2);
		return 15;
	}
	
	for(i = 0; i < N;++i) {
		if (fabs(x[i]) >= (1.0 / fabs(dx[i]))) {
			stepmax = x[i];
		} else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		stepsize[i] = fd * stepmax;
		temp = x[i];
		x[i] += stepsize[i];
		stepsize[i] = x[i] - temp;
		
		f2[i] = FUNCPT_EVAL(funcpt,x,N);
		if (f2[i] >= DBL_MAX || f2[i] <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(stepsize);
			free(f2);
			return 15;
		}
		if (f2[i] != f2[i]) {
			printf("Program Exiting as the function returns NaN");
			free(stepsize);
			free(f2);
			return 15;
		}
		x[i] = temp;
	}
	
	for(i = 0; i < N;++i) { 
		step = i *N;
		temp = x[i];
		x[i] += 2*stepsize[i];
		ft = FUNCPT_EVAL(funcpt, x, N);
		if (ft >= DBL_MAX || ft <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(stepsize);
			free(f2);
			return 15;
		}
		if (ft != ft) {
			printf("Program Exiting as the function returns NaN");
			free(stepsize);
			free(f2);
			return 15;
		}
		f[step+i] = (fc - f2[i] + ft - f2[i])/(stepsize[i] * stepsize[i]);
		x[i] = temp + stepsize[i];
		for(j = i+1; j < N;++j) {
			temp2 = x[j];
			x[j] += stepsize[j];
			ft = FUNCPT_EVAL(funcpt, x, N);
			if (ft >= DBL_MAX || ft <= -DBL_MAX) {
				printf("Program Exiting as the function value exceeds the maximum double value");
				free(stepsize);
				free(f2);
				return 15;
			}
			if (ft != ft) {
				printf("Program Exiting as the function returns NaN");
				free(stepsize);
				free(f2);
				return 15;
			}
			f[step+j] = (fc - f2[i] + ft - f2[j])/(stepsize[i] * stepsize[j]);
			x[j] = temp2;
		}
		x[i] = temp;
			
	}
	
	free(stepsize);
	free(f2);
	return retval;
}